

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element.c
# Opt level: O2

IXML_Attr * ixmlElement_getAttributeNodeNS(IXML_Element *element,char *namespaceURI,char *localName)

{
  IXML_Attr *pIVar1;
  int iVar2;
  Nodeptr *pp_Var3;
  
  if (localName != (char *)0x0 && (namespaceURI != (char *)0x0 && element != (IXML_Element *)0x0)) {
    pp_Var3 = &(element->n).firstAttr;
    while (pIVar1 = (IXML_Attr *)*pp_Var3, pIVar1 != (IXML_Attr *)0x0) {
      iVar2 = strcmp((pIVar1->n).localName,localName);
      if ((iVar2 == 0) && (iVar2 = strcmp((pIVar1->n).namespaceURI,namespaceURI), iVar2 == 0)) {
        return pIVar1;
      }
      pp_Var3 = &(pIVar1->n).nextSibling;
    }
  }
  return (IXML_Attr *)0x0;
}

Assistant:

IXML_Attr *ixmlElement_getAttributeNodeNS(IXML_Element *element,
	const DOMString namespaceURI,
	const DOMString localName)
{
	IXML_Node *attrNode = NULL;

	if (element == NULL || namespaceURI == NULL || localName == NULL) {
		return NULL;
	}

	attrNode = element->n.firstAttr;
	while (attrNode != NULL) {
		if (strcmp(attrNode->localName, localName) == 0 &&
			strcmp(attrNode->namespaceURI, namespaceURI) == 0) {
			/* found it */
			break;
		} else {
			attrNode = attrNode->nextSibling;
		}
	}

	return (IXML_Attr *)attrNode;
}